

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurveSpanIntersection.h
# Opt level: O0

vector<double,_std::allocator<double>_> *
anurbs::CurveSpanIntersection::compute
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,CurveBase<2L> *curve,
          VectorXd *knots_u,VectorXd *knots_v,double tolerance,bool include_curve_knots)

{
  bool bVar1;
  type *this;
  reference pvVar2;
  const_reference pvVar3;
  Index IVar4;
  const_reference pvVar5;
  double local_190;
  iterator local_188;
  value_type *axis;
  iterator __end3_1;
  iterator __begin3_1;
  array<anurbs::CurveSpanIntersection::Axis,_2UL> *__range3_1;
  ParameterPoint b;
  ParameterPoint a;
  Index i;
  reference local_118;
  Interval *span;
  iterator __end3;
  iterator __begin3;
  vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *__range3;
  double t0;
  array<anurbs::CurveSpanIntersection::Axis,_2UL> axes;
  type *points;
  type *ts;
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  local_68;
  byte local_32;
  byte local_31;
  double dStack_30;
  bool include_curve_knots_local;
  double tolerance_local;
  VectorXd *knots_v_local;
  VectorXd *knots_u_local;
  CurveBase<2L> *curve_local;
  vector<double,_std::allocator<double>_> *intersection_parameters;
  
  local_32 = 0;
  local_31 = include_curve_knots;
  dStack_30 = tolerance;
  tolerance_local = (double)knots_v;
  knots_v_local = knots_u;
  knots_u_local = (VectorXd *)curve;
  curve_local = (CurveBase<2L> *)__return_storage_ptr__;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  CurveTessellation<2L>::compute(&local_68,(CurveBaseD *)knots_u_local,dStack_30);
  this = std::
         get<0ul,std::vector<double,std::allocator<double>>,std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>
                   (&local_68);
  axes._M_elems[1].m_tolerance =
       (double)std::
               get<1ul,std::vector<double,std::allocator<double>>,std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>
                         (&local_68);
  std::array<anurbs::CurveSpanIntersection::Axis,_2UL>::array
            ((array<anurbs::CurveSpanIntersection::Axis,_2UL> *)&t0);
  pvVar2 = std::array<anurbs::CurveSpanIntersection::Axis,_2UL>::operator[]
                     ((array<anurbs::CurveSpanIntersection::Axis,_2UL> *)&t0,0);
  Axis::initialize(pvVar2,0,knots_v_local,dStack_30);
  pvVar2 = std::array<anurbs::CurveSpanIntersection::Axis,_2UL>::operator[]
                     ((array<anurbs::CurveSpanIntersection::Axis,_2UL> *)&t0,1);
  Axis::initialize(pvVar2,1,(VectorXd *)tolerance_local,dStack_30);
  if ((local_31 & 1) != 0) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this,0);
    __range3 = (vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *)*pvVar3;
    std::vector<double,_std::allocator<double>_>::push_back
              (__return_storage_ptr__,(value_type_conflict4 *)&__range3);
    (*(code *)(knots_u_local->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
              m_storage.m_data[4])(&__begin3);
    __end3 = std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::begin
                       ((vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *)&__begin3);
    span = (Interval *)
           std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::end
                     ((vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *)&__begin3);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<anurbs::Interval_*,_std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>_>
                                  *)&span);
      if (!bVar1) break;
      local_118 = __gnu_cxx::
                  __normal_iterator<anurbs::Interval_*,_std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>_>
                  ::operator*(&__end3);
      i = (Index)Interval::t1(local_118);
      std::vector<double,_std::allocator<double>_>::push_back
                (__return_storage_ptr__,(value_type_conflict4 *)&i);
      __gnu_cxx::
      __normal_iterator<anurbs::Interval_*,_std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>_>
      ::operator++(&__end3);
    }
    std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::~vector
              ((vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *)&__begin3);
  }
  a.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1] =
       4.94065645841247e-324;
  while( true ) {
    IVar4 = length<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>
                      ((vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                        *)axes._M_elems[1].m_tolerance);
    if (IVar4 <= (long)a.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                       m_storage.m_data.array[1]) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (this,(long)a.second.
                                   super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                                   m_storage.m_data.array[1] - 1);
    pvVar5 = std::
             vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                           *)axes._M_elems[1].m_tolerance,
                          (long)a.second.
                                super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                                m_storage.m_data.array[1] - 1);
    std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::
    pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_true>
              ((pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)
               (b.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                m_data.array + 1),pvVar3,pvVar5);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (this,(size_type)
                             a.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                             m_storage.m_data.array[1]);
    pvVar5 = std::
             vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                           *)axes._M_elems[1].m_tolerance,
                          (size_type)
                          a.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                          m_storage.m_data.array[1]);
    std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::
    pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_true>
              ((pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)&__range3_1,pvVar3,pvVar5);
    __begin3_1 = (iterator)&t0;
    __end3_1 = std::array<anurbs::CurveSpanIntersection::Axis,_2UL>::begin
                         ((array<anurbs::CurveSpanIntersection::Axis,_2UL> *)__begin3_1);
    axis = std::array<anurbs::CurveSpanIntersection::Axis,_2UL>::end
                     ((array<anurbs::CurveSpanIntersection::Axis,_2UL> *)__begin3_1);
    for (; __end3_1 != axis; __end3_1 = __end3_1 + 1) {
      local_188 = __end3_1;
      Axis::intersect(__end3_1,(CurveBase<2L> *)knots_u_local,
                      (ParameterPoint *)
                      (b.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                       m_storage.m_data.array + 1),(ParameterPoint *)&__range3_1,
                      __return_storage_ptr__);
    }
    a.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1]
         = (double)((long)a.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                          m_storage.m_data.array[1] + 1);
  }
  local_190 = 1e-07;
  unique_sorted<std::vector<double,std::allocator<double>>>(__return_storage_ptr__,&local_190);
  local_32 = 1;
  std::array<anurbs::CurveSpanIntersection::Axis,_2UL>::~array
            ((array<anurbs::CurveSpanIntersection::Axis,_2UL> *)&t0);
  std::
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  ::~pair(&local_68);
  if ((local_32 & 1) == 0) {
    std::vector<double,_std::allocator<double>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<double> compute(
        const CurveBase<2>& curve,
        const Eigen::VectorXd& knots_u,
        const Eigen::VectorXd& knots_v,
        const double tolerance,
        const bool include_curve_knots)
    {
        std::vector<double> intersection_parameters;

        // approximate curve with a polyline

        const auto [ts, points] = CurveTessellation<2>::compute(curve, tolerance);

        // initialize axes

        std::array<Axis, 2> axes;

        axes[0].initialize(0, knots_u, tolerance);
        axes[1].initialize(1, knots_v, tolerance);

        // add curve knots

        if (include_curve_knots) {
            double t0 = ts[0];

            intersection_parameters.push_back(t0);

            for (const auto& span : curve.spans()) {
                intersection_parameters.push_back(span.t1());
            }
        }

        // check line segments

        for (Index i = 1; i < length(points); i++) {
            const ParameterPoint a = {ts[i - 1], points[i - 1]};
            const ParameterPoint b = {ts[i], points[i]};

            for (auto& axis : axes) {
                axis.intersect(curve, a, b, intersection_parameters);
            }
        }

        unique_sorted(intersection_parameters);

        return intersection_parameters;
    }